

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::generate_swift_struct_thrift_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_result,bool is_private)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  pointer pptVar4;
  string access;
  string local_78;
  char *local_58;
  long local_50;
  char local_48 [16];
  ulong local_38;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"extension ",10);
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)CONCAT44(extraout_var,iVar1),
                      ((undefined8 *)CONCAT44(extraout_var,iVar1))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : TStruct",10);
  block_open(this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (this->gen_cocoa_ == false) {
    pcVar3 = "public";
    if (is_private) {
      pcVar3 = "fileprivate";
    }
    local_58 = local_48;
    local_38 = (ulong)is_private;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,pcVar3,pcVar3 + local_38 * 5 + 6);
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_78._M_dataplus._M_p,local_78._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," static var fieldIds: [String: Int32]",0x25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    block_open(this,out);
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"return [",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar4 ==
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(out,":",1);
    }
    else {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,((*pptVar4)->name_)._M_dataplus._M_p,
                            ((*pptVar4)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": ",3);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*pptVar4)->key_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        pptVar4 = pptVar4 + 1;
      } while (pptVar4 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    block_close(this,out,true);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_78._M_dataplus._M_p,local_78._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," static var structName: String { return \"",0x29);
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)CONCAT44(extraout_var_00,iVar1),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar1))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" }",3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (tstruct->is_union_ == true) {
      generate_swift_union_reader(this,out,tstruct);
    }
    else {
      generate_swift_struct_reader(this,out,tstruct,SUB81(local_38,0));
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
  }
  else {
    generate_swift_struct_reader(this,out,tstruct,is_private);
    if (is_result) {
      generate_old_swift_struct_result_writer(this,out,tstruct);
    }
    else {
      generate_old_swift_struct_writer(this,out,tstruct,is_private);
    }
  }
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_thrift_extension(ostream& out,
                                                               t_struct* tstruct,
                                                               bool is_result,
                                                               bool is_private) {

  indent(out) << "extension " << tstruct->get_name() << " : TStruct";

  block_open(out);

  out << endl;
  if (!gen_cocoa_) {
    /** Swift 3, no writer we just write field ID's */
    string access = (is_private) ? (gen_cocoa_ ? "private" : "fileprivate") : "public";
    // generate fieldID's dictionary
    out << indent() << access << " static var fieldIds: [String: Int32]";
    block_open(out);
    out << indent() << "return [";
    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;
    bool wrote = false;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      wrote = true;
      out << "\"" << (*f_iter)->get_name() << "\": " << (*f_iter)->get_key() << ", ";
    }
    if (!wrote) {
      // pad a colon
      out << ":";
    }
    out << "]" << endl;
    block_close(out);
    out << endl;
    out << indent() << access << " static var structName: String { return \""
        << tstruct->get_name() << "\" }" << endl << endl;

    if (tstruct->is_union()) {
      generate_swift_union_reader(out, tstruct);
    } else {
      generate_swift_struct_reader(out, tstruct, is_private);
    }
  } else {
    /** Legacy Swift2/Cocoa */

    generate_swift_struct_reader(out, tstruct, is_private);

    if (is_result) {
      generate_old_swift_struct_result_writer(out, tstruct);
    }
    else {
      generate_old_swift_struct_writer(out, tstruct, is_private);
    }
  }

  block_close(out);
  out << endl;
}